

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O1

void __thiscall miniros::observer::Connection::Connection(Connection *this,Connection *other)

{
  Connection *pCVar1;
  int iVar2;
  mutex_t *__mutex;
  
  this->_vptr_Connection = (_func_int **)&PTR__Connection_002ab018;
  if (other->m_container != (Connections *)0x0) {
    __mutex = &other->m_container->m_mutex;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    pCVar1 = other->m_prev;
    this->m_prev = pCVar1;
    this->m_next = other->m_next;
    if (pCVar1 != (Connection *)0x0) {
      pCVar1->m_next = this;
    }
    if (this->m_next != (Connection *)0x0) {
      this->m_next->m_prev = this;
    }
    this->m_container = other->m_container;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  other->m_container = (Connections *)0x0;
  other->m_prev = (Connection *)0x0;
  other->m_next = (Connection *)0x0;
  return;
}

Assistant:

Connection::Connection(Connection&& other) {
    if (other.m_container) {
        std::scoped_lock<impl::Connections> lock(*other.m_container);

        m_prev = other.m_prev;
        m_next = other.m_next;

        if (m_prev) {
            m_prev->m_next = this;
        }
        if (m_next) {
            m_next->m_prev = this;
        }
        m_container = other.m_container;
    }

    other.m_container = nullptr;
    other.m_next = nullptr;
    other.m_prev = nullptr;
}